

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

DPSprite * __thiscall player_t::FindPSprite(player_t *this,int layer)

{
  TObjPtr<DPSprite> *obj;
  DPSprite *pDVar1;
  
  if (layer == 0) {
    return (DPSprite *)0x0;
  }
  obj = &this->psprites;
  while( true ) {
    pDVar1 = GC::ReadBarrier<DPSprite>((DPSprite **)obj);
    if (pDVar1 == (DPSprite *)0x0) {
      return (DPSprite *)0x0;
    }
    if (pDVar1->ID == layer) break;
    obj = &pDVar1->Next;
  }
  return pDVar1;
}

Assistant:

DPSprite *player_t::FindPSprite(int layer)
{
	if (layer == 0)
		return nullptr;

	DPSprite *pspr = psprites;
	while (pspr)
	{
		if (pspr->ID == layer)
			break;

		pspr = pspr->Next;
	}

	return pspr;
}